

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  SyntaxNode *args_4;
  ProceduralAssignStatementSyntax *pPVar1;
  NamedLabelSyntax *local_58;
  Token local_50;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = (NamedLabelSyntax *)
               deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  }
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_4 = deepClone(*(SyntaxNode **)(__fn + 0x68),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_58,args_2,&local_40,
                      (ExpressionSyntax *)args_4,&local_50);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ProceduralAssignStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ProceduralAssignStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}